

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsfft.c
# Opt level: O2

int factors(int M,int *arr)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int *piVar5;
  uint uVar6;
  uint *puVar7;
  
  iVar2 = 0;
  piVar5 = arr;
  while (M % 0x35 == 0) {
    *piVar5 = 0x35;
    piVar5 = piVar5 + 1;
    iVar2 = iVar2 + 1;
    M = M / 0x35;
  }
  while (M % 0x2f == 0) {
    *piVar5 = 0x2f;
    iVar2 = iVar2 + 1;
    piVar5 = piVar5 + 1;
    M = M / 0x2f;
  }
  while (M % 0x2b == 0) {
    *piVar5 = 0x2b;
    iVar2 = iVar2 + 1;
    piVar5 = piVar5 + 1;
    M = M / 0x2b;
  }
  while (M % 0x29 == 0) {
    *piVar5 = 0x29;
    iVar2 = iVar2 + 1;
    piVar5 = piVar5 + 1;
    M = M / 0x29;
  }
  while (M % 0x25 == 0) {
    *piVar5 = 0x25;
    iVar2 = iVar2 + 1;
    piVar5 = piVar5 + 1;
    M = M / 0x25;
  }
  while (M % 0x1f == 0) {
    *piVar5 = 0x1f;
    iVar2 = iVar2 + 1;
    piVar5 = piVar5 + 1;
    M = M / 0x1f;
  }
  while (M % 0x1d == 0) {
    *piVar5 = 0x1d;
    iVar2 = iVar2 + 1;
    piVar5 = piVar5 + 1;
    M = M / 0x1d;
  }
  while (M % 0x17 == 0) {
    *piVar5 = 0x17;
    iVar2 = iVar2 + 1;
    piVar5 = piVar5 + 1;
    M = M / 0x17;
  }
  while (M % 0x13 == 0) {
    *piVar5 = 0x13;
    iVar2 = iVar2 + 1;
    piVar5 = piVar5 + 1;
    M = M / 0x13;
  }
  while (M % 0x11 == 0) {
    *piVar5 = 0x11;
    iVar2 = iVar2 + 1;
    piVar5 = piVar5 + 1;
    M = M / 0x11;
  }
  piVar5 = arr + iVar2;
  while (M % 0xd == 0) {
    *piVar5 = 0xd;
    iVar2 = iVar2 + 1;
    piVar5 = piVar5 + 1;
    M = M / 0xd;
  }
  while (M % 0xb == 0) {
    *piVar5 = 0xb;
    iVar2 = iVar2 + 1;
    piVar5 = piVar5 + 1;
    M = M / 0xb;
  }
  for (; (M & 7U) == 0; M = M >> 3) {
    *piVar5 = 8;
    iVar2 = iVar2 + 1;
    piVar5 = piVar5 + 1;
  }
  while (M % 7 == 0) {
    *piVar5 = 7;
    iVar2 = iVar2 + 1;
    piVar5 = piVar5 + 1;
    M = M / 7;
  }
  while (M % 5 == 0) {
    *piVar5 = 5;
    iVar2 = iVar2 + 1;
    piVar5 = piVar5 + 1;
    M = M / 5;
  }
  for (; (M & 3U) == 0; M = M >> 2) {
    *piVar5 = 4;
    iVar2 = iVar2 + 1;
    piVar5 = piVar5 + 1;
  }
  while (M % 3 == 0) {
    *piVar5 = 3;
    iVar2 = iVar2 + 1;
    piVar5 = piVar5 + 1;
    M = M / 3;
  }
  for (; (M & 1U) == 0; M = M >> 1) {
    *piVar5 = 2;
    iVar2 = iVar2 + 1;
    piVar5 = piVar5 + 1;
  }
  if (0x1f < M) {
    iVar4 = 2;
    while (1 < M) {
      iVar1 = iVar4 * 6 - 1;
      lVar3 = (long)iVar2;
      puVar7 = (uint *)(arr + lVar3);
      while (M % iVar1 == 0) {
        arr[lVar3] = iVar1;
        lVar3 = lVar3 + 1;
        iVar2 = iVar2 + 1;
        puVar7 = puVar7 + 1;
        M = M / iVar1;
      }
      uVar6 = iVar4 * 6 | 1;
      while (M % (int)uVar6 == 0) {
        *puVar7 = uVar6;
        iVar2 = iVar2 + 1;
        puVar7 = puVar7 + 1;
        M = M / (int)uVar6;
      }
      iVar4 = iVar4 + 1;
    }
  }
  return iVar2;
}

Assistant:

int factors(int M, int* arr) {
	int i,N,num,mult,m1,m2;
	i = 0;
	N = M;
	while (N%53 == 0) {
		N = N/53;
		arr[i] = 53;
		i++;
	}
	while (N%47 == 0) {
		N = N/47;
		arr[i] = 47;
		i++;
	}
	while (N%43 == 0) {
		N = N/43;
		arr[i] = 43;
		i++;
	}
	while (N%41 == 0) {
		N = N/41;
		arr[i] = 41;
		i++;
	}
	while (N%37 == 0) {
		N = N/37;
		arr[i] = 37;
		i++;
	}
	while (N%31 == 0) {
		N = N/31;
		arr[i] = 31;
		i++;
	}
	while (N%29 == 0) {
		N = N/29;
		arr[i] = 29;
		i++;
	}
	while (N%23 == 0) {
		N = N/23;
		arr[i] = 23;
		i++;
	}
	while (N%19 == 0) {
		N = N/19;
		arr[i] = 19;
		i++;
	}
	while (N%17 == 0) {
		N = N/17;
		arr[i] = 17;
		i++;
	}
	while (N%13 == 0) {
		N = N/13;
		arr[i] = 13;
		i++;
	}
	while (N%11 == 0) {
		N = N/11;
		arr[i] = 11;
		i++;
	}
	while (N%8 == 0) {
		N = N/8;
		arr[i] = 8;
		i++;
	}
	while (N%7 == 0) {
		N = N/7;
		arr[i] = 7;
		i++;
	}
	while (N%5 == 0) {
		N = N/5;
		arr[i] = 5;
		i++;
	}
	while (N%4 == 0) {
		N = N/4;
		arr[i] = 4;
		i++;
	}
	while (N%3 == 0) {
		N = N/3;
		arr[i] = 3;
		i++;
	}
	while (N%2 == 0) {
		N = N/2;
		arr[i] = 2;
		i++;
	}
	if (N > 31) {
		num = 2;

		while (N > 1) {
			mult = num*6;
			m1 = mult-1;
			m2 = mult+1;
			while (N%m1 == 0 ) {
				arr[i] = m1;
				i++;
				N = N / m1;
			}
			while (N%m2 == 0 ) {
				arr[i] = m2;
				i++;
				N = N / m2;
			}
			num+=1;

		}
	}
	return i;

}